

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void Curl_cookie_clearsess(CookieInfo *ci)

{
  Curl_llist_node *pCVar1;
  Cookie *co;
  Cookie *curr;
  Curl_llist_node *e;
  Curl_llist_node *n;
  uint i;
  CookieInfo *ci_local;
  
  if (ci != (CookieInfo *)0x0) {
    for (n._4_4_ = 0; n._4_4_ < 0x3f; n._4_4_ = n._4_4_ + 1) {
      pCVar1 = Curl_llist_head(ci->cookielist + n._4_4_);
      while (e = pCVar1, e != (Curl_llist_node *)0x0) {
        co = (Cookie *)Curl_node_elem(e);
        pCVar1 = Curl_node_next(e);
        if (co->expires == 0) {
          Curl_node_remove(e);
          freecookie(co);
          ci->numcookies = ci->numcookies - 1;
        }
      }
    }
  }
  return;
}

Assistant:

void Curl_cookie_clearsess(struct CookieInfo *ci)
{
  unsigned int i;

  if(!ci)
    return;

  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    struct Curl_llist_node *n = Curl_llist_head(&ci->cookielist[i]);
    struct Curl_llist_node *e = NULL;

    for(; n; n = e) {
      struct Cookie *curr = Curl_node_elem(n);
      e = Curl_node_next(n); /* in case the node is removed, get it early */
      if(!curr->expires) {
        Curl_node_remove(n);
        freecookie(curr);
        ci->numcookies--;
      }
    }
  }
}